

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool ON_GetClosestPointInPointList
               (int point_count,ON_3dPoint *point_list,ON_3dPoint P,int *closest_point_index)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_40;
  
  uVar2 = 0;
  if ((closest_point_index != (int *)0x0 && point_list != (ON_3dPoint *)0x0) && 0 < point_count) {
    dVar3 = 1e+300;
    uVar1 = 0xffffffff;
    local_40 = 1e+300;
    do {
      dVar5 = point_list->x - P.x;
      dVar5 = dVar5 * dVar5;
      if (((dVar5 < dVar3) &&
          (dVar4 = point_list->y - P.y, dVar5 = dVar4 * dVar4 + dVar5, dVar5 < dVar3)) &&
         (dVar4 = point_list->z - P.z, dVar5 = dVar4 * dVar4 + dVar5, dVar5 < dVar3)) {
        dVar3 = dVar5 * 1.0000000149011612;
        dVar5 = ON_3dPoint::DistanceTo(&P,point_list);
        if (dVar5 < local_40) {
          uVar1 = uVar2;
          local_40 = dVar5;
        }
      }
      point_list = point_list + 1;
      uVar2 = uVar2 + 1;
    } while (point_count != uVar2);
    uVar2 = (uint)(-1 < (int)uVar1);
    if (-1 < (int)uVar1) {
      *closest_point_index = uVar1;
      uVar2 = 1;
    }
  }
  return SUB41(uVar2,0);
}

Assistant:

bool ON_GetClosestPointInPointList( 
          int point_count,
          const ON_3dPoint* point_list,
          ON_3dPoint P,
          int* closest_point_index
          )
{
  bool rc = false;
  if ( point_count>0 && 0 != point_list && closest_point_index )
  {
    double d = 1.0e300;
    double d2 = 1.0e300;
    double x,e;
    int i;
    int best_i = -1;
    //const double* pl = &point_list[0].x;
    for ( i = point_count; i--; point_list++ )
    {
      e = d2;
      x = point_list->x - P.x;
      e = x*x;
      if ( e >= d2 ) continue;
      x = point_list->y - P.y;
      e += x*x;
      if ( e >= d2 ) continue;
      x = point_list->z - P.z;
      e += x*x;
      if ( e >= d2 ) continue;
      d2 = (1.0+ON_SQRT_EPSILON)*e;
      e = P.DistanceTo(*point_list);
      if ( e < d )
      {
        d = e;
        best_i = point_count-i-1;
      }
    }
    if ( best_i >= 0 )
    {
      if ( closest_point_index )
        *closest_point_index = best_i;
      rc = true;
    }
  }
  return rc;
}